

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O1

void stbi_decode_DXT23_alpha_block(uchar *uncompressed,uchar *compressed)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  do {
    iVar1 = (compressed[uVar2 >> 3 & 0x1fffffff] >> ((byte)uVar2 & 4) & 0xf) * 0xff;
    uncompressed[uVar2 + 3] = (uchar)(iVar1 + (iVar1 + 8U >> 4) + 8 >> 4);
    uVar3 = uVar2 + 3;
    uVar2 = uVar2 + 4;
  } while (uVar3 < 0x3c);
  return;
}

Assistant:

void stbi_decode_DXT23_alpha_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int i, next_bit = 0;
	//	each alpha value gets 4 bits
	for( i = 3; i < 16*4; i += 4 )
	{
		uncompressed[i] = stbi_convert_bit_range(
				(compressed[next_bit>>3] >> (next_bit&7)) & 15,
				4, 8 );
		next_bit += 4;
	}
}